

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::RawBufferModifySync_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  uint32 uVar1;
  uint32 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  JsRTRawBufferModifyAction *pJVar6;
  Var aValue;
  ArrayBuffer *pAVar7;
  undefined4 extraout_var;
  byte *trgtBuff;
  Var trgt;
  JsRTRawBufferModifyAction *action;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  pJVar6 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferModifyAction,(TTD::NSLogEvents::EventKind)63>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar6->Trgt);
  bVar3 = Js::VarIs<Js::ArrayBuffer>(aValue);
  if (!bVar3) {
    TTDAbort_unrecoverable_error("Not array buffer object!!!");
  }
  uVar1 = pJVar6->Index;
  uVar2 = pJVar6->Length;
  pAVar7 = Js::VarTo<Js::ArrayBuffer>(aValue);
  uVar4 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    ();
  if (uVar4 < uVar1 + uVar2) {
    TTDAbort_unrecoverable_error("Copy off end of buffer!!!");
  }
  pAVar7 = Js::VarTo<Js::ArrayBuffer>(aValue);
  iVar5 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                    ();
  js_memcpy_s((void *)(CONCAT44(extraout_var,iVar5) + (ulong)pJVar6->Index),(ulong)pJVar6->Length,
              pJVar6->Data,(ulong)pJVar6->Length);
  return;
}

Assistant:

void RawBufferModifySync_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferModifySync>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            TTDAssert(Js::VarIs<Js::ArrayBuffer>(trgt), "Not array buffer object!!!");
            TTDAssert(action->Index + action->Length <= Js::VarTo<Js::ArrayBuffer>(trgt)->GetByteLength(), "Copy off end of buffer!!!");

            byte* trgtBuff = Js::VarTo<Js::ArrayBuffer>(trgt)->GetBuffer() + action->Index;
            js_memcpy_s(trgtBuff, action->Length, action->Data, action->Length);
        }